

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# per_support.c
# Opt level: O3

int32_t per_get_few_bits(asn_per_data_t *pd,int nbits)

{
  ulong uVar1;
  size_t sVar2;
  int32_t iVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  char cVar7;
  uint *puVar8;
  uint uVar9;
  int nbits_00;
  long lVar10;
  ulong uVar11;
  asn_per_data_t tpd;
  asn_per_data_t local_68;
  
  uVar5 = 0xffffffff;
  if (nbits < 0) {
    uVar9 = 0;
    goto LAB_0014c011;
  }
  uVar9 = 0;
  while( true ) {
    uVar6 = pd->nboff;
    lVar10 = pd->nbits - uVar6;
    uVar11 = (ulong)(uint)nbits;
    if ((long)uVar11 <= lVar10) break;
    if ((0x1f < (uint)nbits) || (pd->refill == (_func_int_asn_per_data_s_ptr *)0x0))
    goto LAB_0014c011;
    nbits_00 = (int)lVar10;
    iVar3 = per_get_few_bits(pd,nbits_00);
    if ((iVar3 < 0) || (iVar4 = (*pd->refill)(pd), iVar4 != 0)) goto LAB_0014c011;
    nbits = nbits - nbits_00;
    uVar9 = uVar9 | iVar3 << ((byte)nbits & 0x1f);
    if (nbits < 0) goto LAB_0014c011;
  }
  puVar8 = (uint *)pd->buffer;
  if (7 < uVar6) {
    puVar8 = (uint *)((long)puVar8 + (uVar6 >> 3));
    pd->buffer = (uint8_t *)puVar8;
    pd->nbits = pd->nbits - (uVar6 & 0xfffffffffffffff8);
    uVar6 = (ulong)((uint)uVar6 & 7);
  }
  sVar2 = pd->moved;
  pd->moved = sVar2 + uVar11;
  uVar1 = uVar6 + uVar11;
  pd->nboff = uVar1;
  if (uVar1 < 9) {
    if (uVar11 != 0) {
      uVar5 = (uint)(byte)*puVar8;
      cVar7 = '\b';
      goto LAB_0014bf8a;
    }
    uVar5 = 0;
  }
  else {
    if (uVar1 < 0x11) {
      uVar5 = (uint)(ushort)((ushort)*puVar8 << 8 | (ushort)*puVar8 >> 8);
      cVar7 = '\x10';
    }
    else {
      if (0x18 < uVar1) {
        if (0x1f < uVar1) {
          if ((uint)nbits < 0x20) {
            local_68.buffer = pd->buffer;
            local_68.nboff = pd->nboff;
            local_68.nbits = pd->nbits;
            local_68.moved = pd->moved;
            local_68.refill = pd->refill;
            local_68.refill_key = pd->refill_key;
            if ((long)uVar11 <= (long)local_68.nboff) {
              local_68.moved = local_68.moved - uVar11;
              local_68.nboff = local_68.nboff - uVar11;
            }
            iVar3 = per_get_few_bits(&local_68,nbits - 0x18);
            uVar5 = per_get_few_bits(&local_68,0x18);
            uVar5 = uVar5 | iVar3 << 0x18;
            goto LAB_0014bfff;
          }
          pd->nboff = uVar6;
          pd->moved = sVar2;
          goto LAB_0014c011;
        }
        uVar5 = *puVar8;
        uVar5 = (int)(uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 |
                     uVar5 << 0x18) >> (-(char)uVar1 & 0x1fU);
        goto LAB_0014bfff;
      }
      uVar5 = (uint)*(byte *)((long)puVar8 + 2) |
              (uint)*(byte *)((long)puVar8 + 1) << 8 | (uint)(byte)*puVar8 << 0x10;
      cVar7 = '\x18';
    }
LAB_0014bf8a:
    uVar5 = uVar5 >> (cVar7 - (char)uVar1 & 0x1fU);
  }
LAB_0014bfff:
  uVar5 = ~(-1 << ((byte)nbits & 0x1f)) & uVar5;
LAB_0014c011:
  return uVar9 | uVar5;
}

Assistant:

int32_t
per_get_few_bits(asn_per_data_t *pd, int nbits) {
	size_t off;	/* Next after last bit offset */
	ssize_t nleft;	/* Number of bits left in this stream */
	uint32_t accum;
	const uint8_t *buf;

	if(nbits < 0)
		return -1;

	nleft = pd->nbits - pd->nboff;
	if(nbits > nleft) {
		int32_t tailv, vhead;
		if(!pd->refill || nbits > 31) return -1;
		/* Accumulate unused bytes before refill */
		ASN_DEBUG("Obtain the rest %d bits (want %d)",
			(int)nleft, (int)nbits);
		tailv = per_get_few_bits(pd, nleft);
		if(tailv < 0) return -1;
		/* Refill (replace pd contents with new data) */
		if(pd->refill(pd))
			return -1;
		nbits -= nleft;
		vhead = per_get_few_bits(pd, nbits);
		/* Combine the rest of previous pd with the head of new one */
		tailv = (tailv << nbits) | vhead;  /* Could == -1 */
		return tailv;
	}

	/*
	 * Normalize position indicator.
	 */
	if(pd->nboff >= 8) {
		pd->buffer += (pd->nboff >> 3);
		pd->nbits  -= (pd->nboff & ~0x07);
		pd->nboff  &= 0x07;
	}
	pd->moved += nbits;
	pd->nboff += nbits;
	off = pd->nboff;
	buf = pd->buffer;

	/*
	 * Extract specified number of bits.
	 */
	if(off <= 8)
		accum = nbits ? (buf[0]) >> (8 - off) : 0;
	else if(off <= 16)
		accum = ((buf[0] << 8) + buf[1]) >> (16 - off);
	else if(off <= 24)
		accum = ((buf[0] << 16) + (buf[1] << 8) + buf[2]) >> (24 - off);
	else if(off <= 31)
		accum = ((buf[0] << 24) + (buf[1] << 16)
			+ (buf[2] << 8) + (buf[3])) >> (32 - off);
	else if(nbits <= 31) {
		asn_per_data_t tpd = *pd;
		/* Here are we with our 31-bits limit plus 1..7 bits offset. */
		per_get_undo(&tpd, nbits);
		/* The number of available bits in the stream allow
		 * for the following operations to take place without
		 * invoking the ->refill() function */
		accum  = per_get_few_bits(&tpd, nbits - 24) << 24;
		accum |= per_get_few_bits(&tpd, 24);
	} else {
		per_get_undo(pd, nbits);
		return -1;
	}

	accum &= (((uint32_t)1 << nbits) - 1);

	ASN_DEBUG("  [PER got %2d<=%2d bits => span %d %+ld[%d..%d]:%02x (%d) => 0x%x]",
		(int)nbits, (int)nleft,
		(int)pd->moved,
		(((long)pd->buffer) & 0xf),
		(int)pd->nboff, (int)pd->nbits,
		((pd->buffer != NULL)?pd->buffer[0]:0),
		(int)(pd->nbits - pd->nboff),
		(int)accum);

	return accum;
}